

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isRealTable(Parse *pParse,Table *pTab,int bDrop)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_R9;
  
  iVar1 = 0;
  pcVar3 = "view";
  if (pTab->eTabType != '\x02') {
    pcVar3 = (char *)0x0;
  }
  pcVar2 = "virtual table";
  if (pTab->eTabType != '\x01') {
    pcVar2 = pcVar3;
  }
  if (pcVar2 != (char *)0x0) {
    pcVar3 = "drop column from";
    if (bDrop == 0) {
      pcVar3 = "rename columns of";
    }
    sqlite3ErrorMsg(pParse,"cannot %s %s \"%s\"",pcVar3,pcVar2,pTab->zName,in_R9,0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int isRealTable(Parse *pParse, Table *pTab, int bDrop){
  const char *zType = 0;
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    zType = "view";
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    zType = "virtual table";
  }
#endif
  if( zType ){
    sqlite3ErrorMsg(pParse, "cannot %s %s \"%s\"",
        (bDrop ? "drop column from" : "rename columns of"),
        zType, pTab->zName
    );
    return 1;
  }
  return 0;
}